

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O0

type __thiscall
fmt::v5::formatter<flow::diagnostics::Type,char,void>::
format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
          (formatter<flow::diagnostics::Type,char,void> *this,Type *v,
          basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
          *ctx)

{
  uint *puVar1;
  uint *in_R8;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  undefined4 local_bc;
  basic_string_view<char> local_b8;
  basic_buffer<char> *local_a8;
  basic_string_view<char> local_a0;
  basic_buffer<char> *local_90;
  basic_string_view<char> local_88;
  basic_buffer<char> *local_78;
  basic_string_view<char> local_70;
  basic_buffer<char> *local_60;
  basic_string_view<char> local_58;
  basic_buffer<char> *local_48;
  basic_string_view<char> local_40;
  basic_buffer<char> *local_30;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *local_28;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *ctx_local;
  Type *v_local;
  formatter<flow::diagnostics::Type,_char,_void> *this_local;
  
  puVar1 = &switchD_00188243::switchdataD_00233050;
  local_28 = ctx;
  ctx_local = (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *)v;
  v_local = (Type *)this;
  switch(*v) {
  case TokenError:
    local_30 = (basic_buffer<char> *)
               internal::
               context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ::begin(&ctx->
                        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                      );
    basic_string_view<char>::basic_string_view(&local_40,"TokenError");
    format_str.size_ = (size_t)puVar1;
    format_str.data_ = (char *)local_40.size_;
    this_local = (formatter<flow::diagnostics::Type,_char,_void> *)
                 format_to<fmt::v5::internal::basic_buffer<char>>
                           ((v5 *)local_30,
                            (back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>)
                            local_40.data_,format_str);
    break;
  case SyntaxError:
    local_48 = (basic_buffer<char> *)
               internal::
               context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ::begin(&ctx->
                        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                      );
    basic_string_view<char>::basic_string_view(&local_58,"SyntaxError");
    format_str_00.size_ = (size_t)puVar1;
    format_str_00.data_ = (char *)local_58.size_;
    this_local = (formatter<flow::diagnostics::Type,_char,_void> *)
                 format_to<fmt::v5::internal::basic_buffer<char>>
                           ((v5 *)local_48,
                            (back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>)
                            local_58.data_,format_str_00);
    break;
  case TypeError:
    local_60 = (basic_buffer<char> *)
               internal::
               context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ::begin(&ctx->
                        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                      );
    basic_string_view<char>::basic_string_view(&local_70,"TypeError");
    format_str_01.size_ = (size_t)puVar1;
    format_str_01.data_ = (char *)local_70.size_;
    this_local = (formatter<flow::diagnostics::Type,_char,_void> *)
                 format_to<fmt::v5::internal::basic_buffer<char>>
                           ((v5 *)local_60,
                            (back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>)
                            local_70.data_,format_str_01);
    break;
  case Warning:
    local_78 = (basic_buffer<char> *)
               internal::
               context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ::begin(&ctx->
                        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                      );
    basic_string_view<char>::basic_string_view(&local_88,"Warning");
    format_str_02.size_ = (size_t)puVar1;
    format_str_02.data_ = (char *)local_88.size_;
    this_local = (formatter<flow::diagnostics::Type,_char,_void> *)
                 format_to<fmt::v5::internal::basic_buffer<char>>
                           ((v5 *)local_78,
                            (back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>)
                            local_88.data_,format_str_02);
    break;
  case LinkError:
    local_90 = (basic_buffer<char> *)
               internal::
               context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ::begin(&ctx->
                        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                      );
    basic_string_view<char>::basic_string_view(&local_a0,"LinkError");
    format_str_03.size_ = (size_t)puVar1;
    format_str_03.data_ = (char *)local_a0.size_;
    this_local = (formatter<flow::diagnostics::Type,_char,_void> *)
                 format_to<fmt::v5::internal::basic_buffer<char>>
                           ((v5 *)local_90,
                            (back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>)
                            local_a0.data_,format_str_03);
    break;
  default:
    local_a8 = (basic_buffer<char> *)
               internal::
               context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ::begin(&ctx->
                        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                      );
    basic_string_view<char>::basic_string_view(&local_b8,"{}");
    local_bc = *(undefined4 *)
                &(ctx_local->
                 super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                 ).parse_context_.format_str_.data_;
    format_str_04.size_ = (size_t)&local_bc;
    format_str_04.data_ = (char *)local_b8.size_;
    this_local = (formatter<flow::diagnostics::Type,_char,_void> *)
                 format_to<fmt::v5::internal::basic_buffer<char>,unsigned_int>
                           ((v5 *)local_a8,
                            (back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>)
                            local_b8.data_,format_str_04,in_R8);
  }
  return (type)(basic_buffer<char> *)this_local;
}

Assistant:

constexpr auto format(const Type& v, FormatContext &ctx) {
      switch (v) {
        case Type::TokenError:
          return format_to(ctx.begin(), "TokenError");
        case Type::SyntaxError:
          return format_to(ctx.begin(), "SyntaxError");
        case Type::TypeError:
          return format_to(ctx.begin(), "TypeError");
        case Type::Warning:
          return format_to(ctx.begin(), "Warning");
        case Type::LinkError:
          return format_to(ctx.begin(), "LinkError");
        default:
          return format_to(ctx.begin(), "{}", static_cast<unsigned>(v));
      }
    }